

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-close-stdout-read-stdin.c
# Opt level: O2

int run_test_pipe_close_stdout_read_stdin(void)

{
  int iVar1;
  __pid_t __pid;
  ssize_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  int64_t eval_b;
  int64_t eval_b_2;
  char buf;
  int fd [2];
  int status;
  
  iVar1 = pipe(fd);
  _status = (ulong)iVar1;
  eval_b = 0;
  if (_status == 0) {
    __pid = fork();
    close(fd[1]);
    if (__pid == 0) {
      sVar2 = read(fd[0],&buf,1);
      if (2 < (int)sVar2 + 1U) {
        pcVar3 = "-1 <= r && r <= 1";
        uVar7 = 0x50;
        goto LAB_0015fec3;
      }
      close(0);
      iVar1 = dup(fd[0]);
      _status = (ulong)iVar1;
      eval_b = -1;
      if (_status == 0xffffffffffffffff) {
        pcVar3 = "!=";
        pcVar5 = "-1";
        uVar7 = 0x53;
        goto LAB_0015feff;
      }
      uVar7 = uv_default_loop();
      iVar1 = uv_pipe_init(uVar7,&status,0);
      eval_b = (int64_t)iVar1;
      eval_b_2 = 0;
      if (eval_b == 0) {
        iVar1 = uv_pipe_open(&status,0);
        eval_b = (int64_t)iVar1;
        eval_b_2 = 0;
        if (eval_b == 0) {
          iVar1 = uv_read_start(&status,alloc_buffer,read_stdin);
          eval_b = (int64_t)iVar1;
          eval_b_2 = 0;
          if (eval_b == 0) {
            uVar7 = uv_default_loop();
            iVar1 = uv_run(uVar7,2);
            eval_b = (int64_t)iVar1;
            eval_b_2 = 0;
            if (eval_b == 0) goto LAB_0015fdde;
            pcVar5 = "0";
            pcVar4 = "uv_run(uv_default_loop(), UV_RUN_NOWAIT)";
            uVar7 = 100;
          }
          else {
            pcVar5 = "0";
            pcVar4 = "r";
            uVar7 = 0x5d;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "r";
          uVar7 = 0x5a;
        }
      }
      else {
        pcVar5 = "0";
        pcVar4 = "r";
        uVar7 = 0x57;
      }
    }
    else {
      close(fd[0]);
      waitpid(__pid,&status,0);
      if ((_status & 0xff7f) != 0) {
        pcVar3 = "WIFEXITED(status) && WEXITSTATUS(status) == 0";
        uVar7 = 0x6f;
LAB_0015fec3:
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-close-stdout-read-stdin.c"
                ,uVar7,pcVar3);
        abort();
      }
LAB_0015fdde:
      uVar7 = uv_default_loop();
      uv_walk(uVar7,close_walk_cb,0);
      uv_run(uVar7,0);
      eval_b = 0;
      uVar7 = uv_default_loop();
      iVar1 = uv_loop_close(uVar7);
      eval_b_2 = (int64_t)iVar1;
      if (eval_b_2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar5 = "uv_loop_close(uv_default_loop())";
      pcVar4 = "0";
      uVar7 = 0x72;
    }
    pcVar3 = "==";
    uVar6 = eval_b;
  }
  else {
    pcVar3 = "==";
    pcVar5 = "0";
    uVar7 = 0x40;
LAB_0015feff:
    pcVar4 = "r";
    uVar6 = _status;
    eval_b_2 = eval_b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-close-stdout-read-stdin.c"
          ,uVar7,pcVar4,pcVar3,pcVar5,uVar6,pcVar3,eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(pipe_close_stdout_read_stdin) {
  int r = -1;
  int pid;
  int fd[2];
  int status;
  char buf;
  uv_pipe_t stdin_pipe;

  r = pipe(fd);
  ASSERT_OK(r);
    
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  pid = -1;
#else
  pid = fork();
#endif

  if (pid == 0) {
    /*
     * Make the read side of the pipe our stdin.
     * The write side will be closed by the parent process.
    */
    close(fd[1]);
    /* block until write end of pipe is closed */
    r = read(fd[0], &buf, 1);
    ASSERT(-1 <= r && r <= 1);
    close(0);
    r = dup(fd[0]);
    ASSERT_NE(r, -1);

    /* Create a stream that reads from the pipe. */
    r = uv_pipe_init(uv_default_loop(), (uv_pipe_t *)&stdin_pipe, 0);
    ASSERT_OK(r);

    r = uv_pipe_open((uv_pipe_t *)&stdin_pipe, 0);
    ASSERT_OK(r);

    r = uv_read_start((uv_stream_t *)&stdin_pipe, alloc_buffer, read_stdin);
    ASSERT_OK(r);

    /*
     * Because the other end of the pipe was closed, there should
     * be no event left to process after one run of the event loop.
     * Otherwise, it means that events were not processed correctly.
     */
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_NOWAIT));
  } else {
    /*
     * Close both ends of the pipe so that the child
     * get a POLLHUP event when it tries to read from
     * the other end.
     */
     close(fd[1]);
     close(fd[0]);

    waitpid(pid, &status, 0);
    ASSERT(WIFEXITED(status) && WEXITSTATUS(status) == 0);
  }

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}